

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

void ma_spatializer_get_relative_position_and_direction
               (ma_spatializer *pSpatializer,ma_spatializer_listener *pListener,
               ma_vec3f *pRelativePos,ma_vec3f *pRelativeDir)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ma_vec3f a;
  float fVar6;
  ma_positioning mVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  ma_vec3f mVar12;
  ma_vec3f mVar13;
  ma_vec3f mVar14;
  float local_1d8;
  float fStack_1d4;
  float local_1d0;
  float local_1a0;
  float local_168;
  float fStack_164;
  float local_160;
  float local_138;
  float fStack_134;
  float local_130;
  float local_c0;
  float m [4] [4];
  ma_vec3f axisZ;
  ma_vec3f axisY;
  ma_vec3f axisX;
  ma_vec3f v;
  ma_vec3f *pRelativeDir_local;
  ma_vec3f *pRelativePos_local;
  ma_spatializer_listener *pListener_local;
  ma_spatializer *pSpatializer_local;
  
  if (pRelativePos != (ma_vec3f *)0x0) {
    pRelativePos->x = 0.0;
    pRelativePos->y = 0.0;
    pRelativePos->z = 0.0;
  }
  if (pRelativeDir != (ma_vec3f *)0x0) {
    pRelativeDir->x = 0.0;
    pRelativeDir->y = 0.0;
    pRelativeDir->z = -1.0;
  }
  if (pSpatializer != (ma_spatializer *)0x0) {
    if ((pListener == (ma_spatializer_listener *)0x0) ||
       (mVar7 = ma_spatializer_get_positioning(pSpatializer), mVar7 == ma_positioning_relative)) {
      if (pRelativePos != (ma_vec3f *)0x0) {
        fVar8 = (pSpatializer->position).y;
        pRelativePos->x = (pSpatializer->position).x;
        pRelativePos->y = fVar8;
        pRelativePos->z = (pSpatializer->position).z;
      }
      if (pRelativeDir != (ma_vec3f *)0x0) {
        fVar8 = (pSpatializer->direction).y;
        pRelativeDir->x = (pSpatializer->direction).x;
        pRelativeDir->y = fVar8;
        pRelativeDir->z = (pSpatializer->direction).z;
      }
    }
    else {
      mVar12 = ma_vec3f_normalize(pListener->direction);
      local_c0 = mVar12.z;
      mVar13 = ma_vec3f_cross(mVar12,(pListener->config).worldUp);
      mVar13 = ma_vec3f_normalize(mVar13);
      local_130 = mVar13.z;
      _local_138 = mVar13._0_8_;
      axisX.x = local_130;
      axisY.y = local_138;
      axisY.z = fStack_134;
      fVar8 = ma_vec3f_len2(mVar13);
      if ((fVar8 == 0.0) && (!NAN(fVar8))) {
        mVar13 = ma_vec3f_init_3f(1.0,0.0,0.0);
        _local_168 = mVar13._0_8_;
        local_160 = mVar13.z;
        axisY.y = local_168;
        axisY.z = fStack_164;
        axisX.x = local_160;
      }
      mVar13.z = axisX.x;
      mVar13.x = axisY.y;
      mVar13.y = axisY.z;
      mVar13 = ma_vec3f_cross(mVar13,mVar12);
      local_1a0 = mVar13.z;
      if ((pListener->config).handedness == ma_handedness_left) {
        mVar14.z = axisX.x;
        mVar14.x = axisY.y;
        mVar14.y = axisY.z;
        mVar14 = ma_vec3f_neg(mVar14);
        _local_1d8 = mVar14._0_8_;
        local_1d0 = mVar14.z;
        axisY.y = local_1d8;
        axisY.z = fStack_1d4;
        axisX.x = local_1d0;
      }
      fVar8 = axisY.y;
      fVar6 = axisY.z;
      a.z = axisX.x;
      a.x = axisY.y;
      a.y = axisY.z;
      fVar9 = ma_vec3f_dot(a,pListener->position);
      axisZ.y = mVar13.x;
      axisZ.z = mVar13.y;
      fVar10 = ma_vec3f_dot(mVar13,pListener->position);
      m[3][2] = mVar12.x;
      m[3][3] = mVar12.y;
      mVar12 = ma_vec3f_neg(mVar12);
      fVar11 = ma_vec3f_dot(mVar12,pListener->position);
      if (pRelativePos != (ma_vec3f *)0x0) {
        uVar2 = (pSpatializer->position).x;
        uVar4 = (pSpatializer->position).y;
        fVar1 = (pSpatializer->position).z;
        pRelativePos->x = -fVar9 + axisX.x * fVar1 + fVar8 * (float)uVar2 + fVar6 * (float)uVar4;
        pRelativePos->y =
             -fVar10 + local_1a0 * fVar1 + axisZ.y * (float)uVar2 + axisZ.z * (float)uVar4;
        pRelativePos->z =
             -fVar11 + -local_c0 * fVar1 + -m[3][2] * (float)uVar2 + -m[3][3] * (float)uVar4;
      }
      if (pRelativeDir != (ma_vec3f *)0x0) {
        uVar3 = (pSpatializer->direction).x;
        uVar5 = (pSpatializer->direction).y;
        fVar9 = (pSpatializer->direction).z;
        pRelativeDir->x = axisX.x * fVar9 + fVar8 * (float)uVar3 + fVar6 * (float)uVar5;
        pRelativeDir->y = local_1a0 * fVar9 + axisZ.y * (float)uVar3 + axisZ.z * (float)uVar5;
        pRelativeDir->z = -local_c0 * fVar9 + -m[3][2] * (float)uVar3 + -m[3][3] * (float)uVar5;
      }
    }
  }
  return;
}

Assistant:

MA_API void ma_spatializer_get_relative_position_and_direction(const ma_spatializer* pSpatializer, const ma_spatializer_listener* pListener, ma_vec3f* pRelativePos, ma_vec3f* pRelativeDir)
{
    if (pRelativePos != NULL) {
        pRelativePos->x = 0;
        pRelativePos->y = 0;
        pRelativePos->z = 0;
    }

    if (pRelativeDir != NULL) {
        pRelativeDir->x = 0;
        pRelativeDir->y = 0;
        pRelativeDir->z = -1;
    }

    if (pSpatializer == NULL) {
        return;
    }

    if (pListener == NULL || ma_spatializer_get_positioning(pSpatializer) == ma_positioning_relative) {
        /* There's no listener or we're using relative positioning. */
        if (pRelativePos != NULL) {
            *pRelativePos = pSpatializer->position;
        }
        if (pRelativeDir != NULL) {
            *pRelativeDir = pSpatializer->direction;
        }
    } else {
        ma_vec3f v;
        ma_vec3f axisX;
        ma_vec3f axisY;
        ma_vec3f axisZ;
        float m[4][4];

        /*
        We need to calcualte the right vector from our forward and up vectors. This is done with
        a cross product.
        */
        axisZ = ma_vec3f_normalize(pListener->direction);                               /* Normalization required here because we can't trust the caller. */
        axisX = ma_vec3f_normalize(ma_vec3f_cross(axisZ, pListener->config.worldUp));   /* Normalization required here because the world up vector may not be perpendicular with the forward vector. */

        /*
        The calculation of axisX above can result in a zero-length vector if the listener is
        looking straight up on the Y axis. We'll need to fall back to a +X in this case so that
        the calculations below don't fall apart. This is where a quaternion based listener and
        sound orientation would come in handy.
        */
        if (ma_vec3f_len2(axisX) == 0) {
            axisX = ma_vec3f_init_3f(1, 0, 0);
        }

        axisY = ma_vec3f_cross(axisX, axisZ);                                           /* No normalization is required here because axisX and axisZ are unit length and perpendicular. */

        /*
        We need to swap the X axis if we're left handed because otherwise the cross product above
        will have resulted in it pointing in the wrong direction (right handed was assumed in the
        cross products above).
        */
        if (pListener->config.handedness == ma_handedness_left) {
            axisX = ma_vec3f_neg(axisX);
        }

        /* Lookat. */
        m[0][0] =  axisX.x; m[1][0] =  axisX.y; m[2][0] =  axisX.z; m[3][0] = -ma_vec3f_dot(axisX,               pListener->position);
        m[0][1] =  axisY.x; m[1][1] =  axisY.y; m[2][1] =  axisY.z; m[3][1] = -ma_vec3f_dot(axisY,               pListener->position);
        m[0][2] = -axisZ.x; m[1][2] = -axisZ.y; m[2][2] = -axisZ.z; m[3][2] = -ma_vec3f_dot(ma_vec3f_neg(axisZ), pListener->position);
        m[0][3] = 0;        m[1][3] = 0;        m[2][3] = 0;        m[3][3] = 1;

        /*
        Multiply the lookat matrix by the spatializer position to transform it to listener
        space. This allows calculations to work based on the sound being relative to the
        origin which makes things simpler.
        */
        if (pRelativePos != NULL) {
            v = pSpatializer->position;
            pRelativePos->x = m[0][0] * v.x + m[1][0] * v.y + m[2][0] * v.z + m[3][0] * 1;
            pRelativePos->y = m[0][1] * v.x + m[1][1] * v.y + m[2][1] * v.z + m[3][1] * 1;
            pRelativePos->z = m[0][2] * v.x + m[1][2] * v.y + m[2][2] * v.z + m[3][2] * 1;
        }

        /*
        The direction of the sound needs to also be transformed so that it's relative to the
        rotation of the listener.
        */
        if (pRelativeDir != NULL) {
            v = pSpatializer->direction;
            pRelativeDir->x = m[0][0] * v.x + m[1][0] * v.y + m[2][0] * v.z;
            pRelativeDir->y = m[0][1] * v.x + m[1][1] * v.y + m[2][1] * v.z;
            pRelativeDir->z = m[0][2] * v.x + m[1][2] * v.y + m[2][2] * v.z;
        }
    }
}